

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O0

void run_collapse_task(parallel_task_1d *task,size_t thread_id)

{
  int *piVar1;
  bbox bbox;
  bbox bbox_00;
  bbox bbox_01;
  real_t rVar2;
  float in_stack_ffffffffffffff00;
  real_t in_stack_ffffffffffffff04;
  float local_f4;
  float local_e8;
  float local_dc;
  bbox local_d8;
  bbox local_c0;
  float local_a4;
  float cost;
  real_t rStack_98;
  real_t rStack_94;
  real_t local_90;
  real_t rStack_8c;
  float local_84;
  ulong uStack_80;
  float collapse_cost;
  size_t total_count;
  bvh_node *right;
  bvh_node *left;
  size_t right_count;
  size_t left_count;
  bvh_node *parent;
  size_t local_48;
  size_t first_child;
  size_t j;
  bvh_node *node;
  size_t n;
  size_t i;
  collapse_task *collapse_task;
  size_t thread_id_local;
  parallel_task_1d *task_local;
  
  n = (task->range).begin;
  node = (bvh_node *)(task->range).end;
  local_e8 = in_stack_ffffffffffffff00;
  i = (size_t)task;
  collapse_task = (collapse_task *)thread_id;
  thread_id_local = (size_t)task;
  do {
    if (node <= n) {
      return;
    }
    j = *(long *)(i + 0x20) + n * 0x20;
    if (*(int *)(j + 0x18) != 0) {
      *(ulong *)(*(long *)(i + 0x30) + n * 8) = (ulong)*(uint *)(j + 0x18);
      first_child = n;
      while( true ) {
        local_48 = left_sibling(first_child);
        first_child = *(size_t *)(*(long *)(i + 0x38) + first_child * 8);
        if (first_child == 0xffffffffffffffff) break;
        parent._4_4_ = 1;
        LOCK();
        piVar1 = (int *)(*(long *)(i + 0x40) + first_child * 4);
        parent._0_4_ = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
        if ((int)parent == 0) break;
        left_count = *(long *)(i + 0x20) + first_child * 0x20;
        if (local_48 != ((bvh_node *)left_count)->first_child_or_primitive) {
          __assert_fail("first_child == parent->first_child_or_primitive",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/accel/bvh.c"
                        ,0x197,"void run_collapse_task(struct parallel_task_1d *, size_t)");
        }
        right_count = *(size_t *)(*(long *)(i + 0x30) + local_48 * 8);
        left = *(bvh_node **)(*(long *)(i + 0x30) + 8 + local_48 * 8);
        if ((right_count == 0) || (left == (bvh_node *)0x0)) break;
        right = (bvh_node *)(*(long *)(i + 0x20) + local_48 * 0x20);
        total_count = local_48 * 0x20 + 0x20 + *(long *)(i + 0x20);
        uStack_80 = (long)left->bounds + right_count;
        get_bvh_node_bbox((bbox *)&stack0xffffffffffffff60,(bvh_node *)left_count);
        bbox.min._[2] = local_90;
        bbox.max._[0] = rStack_8c;
        bbox.min._[0] = rStack_98;
        bbox.min._[1] = rStack_94;
        bbox.max._[1] = local_e8;
        bbox.max._[2] = in_stack_ffffffffffffff04;
        rVar2 = half_bbox_area(bbox);
        local_dc = (float)uStack_80;
        local_84 = rVar2 * (local_dc - *(float *)(i + 0x48));
        get_bvh_node_bbox(&local_c0,right);
        bbox_00.min._[2] = local_c0.max._[1];
        bbox_00.max._[0] = local_c0.max._[2];
        bbox_00.min._[0] = local_c0.min._[2];
        bbox_00.min._[1] = local_c0.max._[0];
        bbox_00.max._[1] = local_e8;
        bbox_00.max._[2] = in_stack_ffffffffffffff04;
        rVar2 = half_bbox_area(bbox_00);
        local_e8 = (float)right_count;
        get_bvh_node_bbox(&local_d8,(bvh_node *)total_count);
        bbox_01.min._[2] = local_d8.max._[1];
        bbox_01.max._[0] = local_d8.max._[2];
        bbox_01.min._[0] = local_d8.min._[2];
        bbox_01.min._[1] = local_d8.max._[0];
        bbox_01.max._[1] = local_e8;
        bbox_01.max._[2] = in_stack_ffffffffffffff04;
        in_stack_ffffffffffffff04 = half_bbox_area(bbox_01);
        local_f4 = (float)left;
        local_a4 = rVar2 * local_e8 + in_stack_ffffffffffffff04 * local_f4;
        if (local_84 < local_a4) {
          *(ulong *)(*(long *)(i + 0x30) + first_child * 8) = uStack_80;
          *(undefined8 *)(*(long *)(i + 0x30) + local_48 * 8) = 0;
          *(undefined8 *)(*(long *)(i + 0x30) + 8 + local_48 * 8) = 0;
          *(undefined8 *)(*(long *)(i + 0x28) + local_48 * 8) = 0;
          *(undefined8 *)(*(long *)(i + 0x28) + 8 + local_48 * 8) = 0;
        }
      }
    }
    n = n + 1;
  } while( true );
}

Assistant:

static void run_collapse_task(struct parallel_task_1d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct collapse_task* collapse_task = (void*)task;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        const struct bvh_node* node = &collapse_task->nodes[i];
        if (node->primitive_count == 0)
            continue;

        collapse_task->primitive_counts[i] = node->primitive_count;

        // Walk up the parents of this node towards the root
        size_t j = i;
        while (true) {
            size_t first_child = left_sibling(j);
            j = collapse_task->parents[j];

            // Terminate this path if the root has been reached or the two children have not yet been processed
            if (j == SIZE_MAX || atomic_fetch_add_explicit(&collapse_task->flags[j], 1, memory_order_relaxed) == 0)
                break;

            const struct bvh_node* parent = &collapse_task->nodes[j];
            assert(first_child == parent->first_child_or_primitive);

            size_t left_count  = collapse_task->primitive_counts[first_child + 0];
            size_t right_count = collapse_task->primitive_counts[first_child + 1];
            // Both children must be leaves in order to collapse this node
            if (left_count == 0 || right_count == 0)
                break;

            const struct bvh_node* left  = &collapse_task->nodes[first_child + 0];
            const struct bvh_node* right = &collapse_task->nodes[first_child + 1];
            size_t total_count = left_count + right_count;
            float collapse_cost =
                half_bbox_area(get_bvh_node_bbox(parent)) * (total_count - collapse_task->traversal_cost);
            float cost =
                half_bbox_area(get_bvh_node_bbox(left))  * left_count +
                half_bbox_area(get_bvh_node_bbox(right)) * right_count;
            if (collapse_cost < cost) {
                collapse_task->primitive_counts[j] = total_count;
                collapse_task->primitive_counts[first_child + 0] = 0;
                collapse_task->primitive_counts[first_child + 1] = 0;
                collapse_task->node_counts[first_child + 0] = 0;
                collapse_task->node_counts[first_child + 1] = 0;
            }
        }
    }
}